

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_reflecttitle(_glist *x)

{
  t_atom *ptVar1;
  undefined8 uVar2;
  _canvasenvironment *p_Var3;
  size_t sVar4;
  t_symbol *ptVar5;
  int local_404;
  int i;
  _canvasenvironment *env;
  char namebuf [1000];
  _glist *x_local;
  
  namebuf._992_8_ = x;
  p_Var3 = canvas_getenv(x);
  if ((*(ushort *)(namebuf._992_8_ + 0xe8) & 1) == 0) {
    bug("canvas_reflecttitle");
  }
  else {
    if (p_Var3->ce_argc == 0) {
      env._0_1_ = 0;
    }
    else {
      strcpy((char *)&env," (");
      local_404 = 0;
      while ((local_404 < p_Var3->ce_argc && (sVar4 = strlen((char *)&env), sVar4 < 0x1f0))) {
        if (local_404 != 0) {
          strcat((char *)&env," ");
        }
        ptVar1 = p_Var3->ce_argv;
        sVar4 = strlen((char *)&env);
        atom_string(ptVar1 + local_404,namebuf + (sVar4 - 8),500);
        local_404 = local_404 + 1;
      }
      strcat((char *)&env,")");
    }
    if ((*(ushort *)(namebuf._992_8_ + 0xe8) >> 5 & 1) != 0) {
      sVar4 = strlen((char *)&env);
      strncat((char *)&env," [edit]",999 - sVar4);
      namebuf[0x3df] = '\0';
    }
    uVar2 = namebuf._992_8_;
    ptVar5 = canvas_getdir((_glist *)namebuf._992_8_);
    pdgui_vmess("pdtk_canvas_reflecttitle","^ sss i",uVar2,ptVar5->s_name,
                **(undefined8 **)(namebuf._992_8_ + 200),&env,
                (uint)(*(ushort *)(namebuf._992_8_ + 0xe8) >> 2 & 1));
  }
  return;
}

Assistant:

void canvas_reflecttitle(t_canvas *x)
{
    char namebuf[MAXPDSTRING];
    t_canvasenvironment *env = canvas_getenv(x);
    if (!x->gl_havewindow)
    {
        bug("canvas_reflecttitle");
        return;
    }
    if (env->ce_argc)
    {
        int i;
        strcpy(namebuf, " (");
        for (i = 0; i < env->ce_argc; i++)
        {
            if (strlen(namebuf) > MAXPDSTRING/2 - 5)
                break;
            if (i != 0)
                strcat(namebuf, " ");
            atom_string(&env->ce_argv[i], namebuf + strlen(namebuf),
                MAXPDSTRING/2);
        }
        strcat(namebuf, ")");
    }
    else namebuf[0] = 0;
    if (x->gl_edit)
    {
        strncat(namebuf, " [edit]", MAXPDSTRING-strlen(namebuf)-1);
        namebuf[MAXPDSTRING-1] = 0;
    }
    pdgui_vmess("pdtk_canvas_reflecttitle", "^ sss i",
        x,
        canvas_getdir(x)->s_name, x->gl_name->s_name, namebuf,
        x->gl_dirty);
}